

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O0

oonf_layer2_neigh * dlep_session_get_l2_from_neighbor(dlep_local_neighbor *dlep_neigh)

{
  undefined4 uVar1;
  undefined8 uVar2;
  oonf_layer2_net *local_f8;
  long local_f0;
  undefined1 local_e3 [8];
  oonf_layer2_neigh_key_str nbuf;
  oonf_layer2_net *l2net;
  oonf_layer2_neigh *l2neigh;
  dlep_local_neighbor *dlep_neigh_local;
  undefined4 local_60;
  uint local_5c;
  undefined *local_58;
  undefined4 local_50;
  uint local_4c;
  undefined *local_48;
  char *local_40;
  undefined1 *local_38;
  long local_30;
  undefined8 local_28;
  long local_20;
  undefined8 local_18;
  long local_10;
  
  local_40 = (dlep_neigh->session->l2_listener).name;
  l2neigh = (oonf_layer2_neigh *)dlep_neigh;
  uVar2 = oonf_layer2_get_net_tree();
  local_10 = avl_find(uVar2,local_40);
  local_18 = 0x7a0;
  if (local_10 == 0) {
    local_f0 = 0;
  }
  else {
    local_f0 = local_10 + -0x7a0;
  }
  nbuf._91_8_ = local_f0;
  if (local_f0 == 0) {
    local_4c = *(uint *)(*(long *)((l2neigh->_next_hop_v6)._addr + 10) + 0x130);
    local_48 = &log_global_mask;
    local_50 = 1;
    if (((&log_global_mask)[local_4c] & 1) != 0) {
      oonf_log(1,*(undefined4 *)(*(long *)((l2neigh->_next_hop_v6)._addr + 10) + 0x130),
               "src/generic/dlep/dlep_session.c",0x224,0,0,
               "Could not find l2net %s for new neighbor",
               *(undefined8 *)(*(long *)((l2neigh->_next_hop_v6)._addr + 10) + 0x138));
    }
    dlep_neigh_local = (dlep_local_neighbor *)0x0;
  }
  else {
    local_38 = (undefined1 *)((long)&l2neigh->network + 2);
    local_30 = local_f0;
    local_20 = avl_find(local_f0 + 0x90,local_38);
    local_28 = 0x4c0;
    if (local_20 == 0) {
      local_f8 = (oonf_layer2_net *)0x0;
    }
    else {
      local_f8 = (oonf_layer2_net *)(local_20 + -0x4c0);
    }
    l2net = local_f8;
    if (local_f8 == (oonf_layer2_net *)0x0) {
      local_5c = *(uint *)(*(long *)((l2neigh->_next_hop_v6)._addr + 10) + 0x130);
      local_58 = &log_global_mask;
      local_60 = 2;
      if (((&log_global_mask)[local_5c] & 2) != 0) {
        uVar1 = *(undefined4 *)(*(long *)((l2neigh->_next_hop_v6)._addr + 10) + 0x130);
        uVar2 = oonf_layer2_neigh_key_to_string
                          (local_e3,(undefined1 *)((long)&l2neigh->network + 2),1);
        oonf_log(2,uVar1,"src/generic/dlep/dlep_session.c",0x22c,0,0,
                 "Could not find l2neigh for neighbor %s",uVar2);
      }
      dlep_neigh_local = (dlep_local_neighbor *)0x0;
    }
    else {
      dlep_neigh_local = (dlep_local_neighbor *)local_f8;
    }
  }
  return (oonf_layer2_neigh *)dlep_neigh_local;
}

Assistant:

struct oonf_layer2_neigh *
dlep_session_get_l2_from_neighbor(struct dlep_local_neighbor *dlep_neigh) {
  struct oonf_layer2_neigh *l2neigh;
  struct oonf_layer2_net *l2net;
#ifdef OONF_LOG_INFO
  union oonf_layer2_neigh_key_str nbuf;
#endif

  l2net = oonf_layer2_net_get(dlep_neigh->session->l2_listener.name);
  if (!l2net) {
    OONF_DEBUG(dlep_neigh->session->log_source, "Could not find l2net %s for new neighbor",
      dlep_neigh->session->l2_listener.name);
    return NULL;
  }

  l2neigh = oonf_layer2_neigh_get_lid(l2net, &dlep_neigh->neigh_key);
  if (!l2neigh) {
    OONF_INFO(dlep_neigh->session->log_source,
      "Could not find l2neigh for neighbor %s",
      oonf_layer2_neigh_key_to_string(&nbuf, &dlep_neigh->neigh_key, true));
    return NULL;
  }
  return l2neigh;
}